

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.cpp
# Opt level: O0

int wasm::Bits::countTrailingZeroes(uint64_t v)

{
  uint64_t v_local;
  
  if (v == 0) {
    v_local._4_4_ = 0x40;
  }
  else {
    v_local._4_4_ = 0;
    for (; (v & 1) == 0; v = v >> 1 | 0x8000000000000000) {
      v_local._4_4_ = v_local._4_4_ + 1;
    }
  }
  return v_local._4_4_;
}

Assistant:

int countTrailingZeroes(uint64_t v) {
  if (v == 0) {
    return 64;
  }
#if __has_builtin(__builtin_ctzll) || defined(__GNUC__)
  return __builtin_ctzll(v);
#elif defined(_MSC_VER) && defined(_M_X64)
  unsigned long count;
  _BitScanForward64(&count, v);
  return (int)count;
#else
  return (uint32_t)v ? countTrailingZeroes((uint32_t)v)
                     : 32 + countTrailingZeroes((uint32_t)(v >> 32));
#endif
}